

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

void terminal_echo(int yn)

{
  int in_EDI;
  termios newt;
  termios oldt;
  termios local_7c;
  termios local_40;
  int local_4;
  
  local_4 = in_EDI;
  tcgetattr(0,&local_40);
  memcpy(&local_7c,&local_40,0x3c);
  if (local_4 == 0) {
    local_7c.c_lflag = local_7c.c_lflag & 0xfffffff7;
  }
  else {
    local_7c.c_lflag = local_7c.c_lflag | 8;
  }
  tcsetattr(0,0,&local_7c);
  return;
}

Assistant:

void terminal_echo(int yn)
{
	struct termios oldt, newt;
	tcgetattr(0, &oldt);
	newt = oldt;
	if (!yn) newt.c_lflag &= ~ECHO;
	else newt.c_lflag |= ECHO;
	tcsetattr(0, TCSANOW, &newt);
}